

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

void DelOld(PProfileList list,PProfile_conflict profile)

{
  PProfile_conflict local_28;
  PProfile_conflict current;
  PProfile_conflict *old;
  PProfile_conflict profile_local;
  PProfileList list_local;
  
  local_28 = *list;
  current = (PProfile_conflict)list;
  while( true ) {
    if (local_28 == (PProfile_conflict)0x0) {
      return;
    }
    if (local_28 == profile) break;
    current = (PProfile_conflict)&local_28->link;
    local_28 = *(PProfile_conflict *)current;
  }
  current->X = (FT_F26Dot6)local_28->link;
  return;
}

Assistant:

static void
  DelOld( PProfileList    list,
          const PProfile  profile )
  {
    PProfile  *old, current;


    old     = list;
    current = *old;

    while ( current )
    {
      if ( current == profile )
      {
        *old = current->link;
        return;
      }

      old     = &current->link;
      current = *old;
    }

    /* we should never get there, unless the profile was not part of */
    /* the list.                                                     */
  }